

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O3

tm * OPENSSL_gmtime(time_t *time,tm *out_tm)

{
  int iVar1;
  tm *ptVar2;
  
  iVar1 = OPENSSL_posix_to_tm(*time,out_tm);
  ptVar2 = (tm *)0x0;
  if (iVar1 != 0) {
    ptVar2 = out_tm;
  }
  return ptVar2;
}

Assistant:

struct tm *OPENSSL_gmtime(const time_t *time, struct tm *out_tm) {
  static_assert(
      sizeof(time_t) == sizeof(int32_t) || sizeof(time_t) == sizeof(int64_t),
      "time_t is broken");
  int64_t posix_time = *time;
  if (!OPENSSL_posix_to_tm(posix_time, out_tm)) {
    return NULL;
  }
  return out_tm;
}